

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  char cVar1;
  StringRef Chars;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  long lVar6;
  StringRef *component;
  StringRef *this;
  bool bVar7;
  undefined1 local_170 [8];
  SmallString<32U> a_storage;
  SmallString<32U> b_storage;
  SmallString<32U> c_storage;
  SmallString<32U> d_storage;
  SmallVector<llvm::StringRef,_4U> components;
  Twine local_50;
  undefined4 local_34;
  
  local_170 = (undefined1  [8])
              &a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       (void *)0x400000000;
  if (EmptyKind < a->LHSKind) {
    local_50._0_16_ = Twine::toStringRef(a,(SmallVectorImpl<char> *)local_170);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_50);
  }
  if (EmptyKind < b->LHSKind) {
    local_50._0_16_ =
         Twine::toStringRef(b,(SmallVectorImpl<char> *)
                              (a_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_50);
  }
  if (EmptyKind < c->LHSKind) {
    local_50._0_16_ =
         Twine::toStringRef(c,(SmallVectorImpl<char> *)
                              (b_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_50);
  }
  if (EmptyKind < d->LHSKind) {
    local_50._0_16_ =
         Twine::toStringRef(d,(SmallVectorImpl<char> *)
                              (c_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_50);
  }
  if (((ulong)components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX &
      0xffffffff) != 0) {
    bVar7 = style == windows;
    pcVar5 = "/";
    if (bVar7) {
      pcVar5 = "\\/";
    }
    local_34 = 0x2f;
    if (bVar7) {
      local_34 = 0x5c;
    }
    lVar6 = ((ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    BeginX & 0xffffffff) << 4;
    this = (StringRef *)
           d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
           _24_8_;
    components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].buffer._8_8_ = pcVar5;
    do {
      uVar3 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar3 == 0) {
LAB_00d9a438:
        if (((this->Length == 0) ||
            ((*this->Data != '/' && ((style != windows || (*this->Data != '\\')))))) && (uVar3 != 0)
           ) {
          Twine::Twine(&local_50,this);
          bVar2 = has_root_name(&local_50,style);
          if (!bVar2) {
            local_50.LHS.character = (char)local_34;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&path->super_SmallVectorTemplateBase<char,_true>,(char *)&local_50);
          }
        }
        SmallVectorImpl<char>::append<char_const*,void>(path,this->Data,this->Data + this->Length);
      }
      else {
        cVar1 = *(char *)((long)(path->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + (uVar3 - 1));
        if ((cVar1 != '/') && (style != windows || cVar1 != '\\')) goto LAB_00d9a438;
        Chars.Length = (ulong)bVar7 + 1;
        Chars.Data = (char *)components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
                             buffer._8_8_;
        sVar4 = StringRef::find_first_not_of(this,Chars,0);
        uVar3 = this->Length;
        if (uVar3 < sVar4) {
          sVar4 = uVar3;
        }
        SmallVectorImpl<char>::append<char_const*,void>(path,this->Data + sVar4,this->Data + uVar3);
      }
      this = this + 1;
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != 0);
  }
  if ((uint *)d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
              _24_8_ !=
      &components.super_SmallVectorImpl<llvm::StringRef>.
       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
    free((void *)d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                 InlineElts._24_8_);
  }
  if ((uint *)c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
              _24_8_ !=
      &d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                 InlineElts._24_8_);
  }
  if ((uint *)b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
              _24_8_ !=
      &c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                 InlineElts._24_8_);
  }
  if ((uint *)a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
              _24_8_ !=
      &b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                 InlineElts._24_8_);
  }
  if (local_170 !=
      (undefined1  [8])
      &a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_170);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}